

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

_Bool tlb_force_broadcast(CPUARMState_conflict *env)

{
  ulong uVar1;
  uint uVar2;
  
  if (((env->cp15).hcr_el2 & 0x200) == 0) {
    return false;
  }
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar2 = env->uncached_cpsr & 0x1f;
      if ((uVar2 < 0x1b) && ((0x4410000U >> uVar2 & 1) != 0)) {
        return false;
      }
      if ((uVar1 >> 0x21 & 1) != 0) {
        if (uVar2 == 0x16) {
          if (((uint)uVar1 >> 0x1c & 1) == 0) {
            return false;
          }
        }
        else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) {
          return false;
        }
      }
      goto LAB_0061a212;
    }
    uVar2 = env->pstate >> 2 & 3;
  }
  else {
    if ((env->v7m).exception != 0) goto LAB_0061a212;
    uVar2 = ~(env->v7m).control[(env->v7m).secure] & 1;
  }
  if (uVar2 != 1) {
    return false;
  }
LAB_0061a212:
  if ((uVar1 >> 0x21 & 1) == 0) {
    return false;
  }
  return ((env->cp15).scr_el3 & 1) == 0;
}

Assistant:

static bool tlb_force_broadcast(CPUARMState *env)
{
    return (env->cp15.hcr_el2 & HCR_FB) &&
        arm_current_el(env) == 1 && arm_is_secure_below_el3(env);
}